

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_helper.c
# Opt level: O0

int mipmap_image(uchar *orig,int width,int height,int channels,uchar *resampled,int block_size_x,
                int block_size_y)

{
  int local_60;
  int block_area;
  int v_block;
  int u_block;
  int v;
  int u;
  int sum_value;
  int index;
  int c;
  int j;
  int i;
  int mip_height;
  int mip_width;
  int block_size_x_local;
  uchar *resampled_local;
  int channels_local;
  int height_local;
  int width_local;
  uchar *orig_local;
  
  if ((((width < 1) || (height < 1)) || (channels < 1)) ||
     (((orig == (uchar *)0x0 || (resampled == (uchar *)0x0)) ||
      ((block_size_x < 1 || (block_size_y < 1)))))) {
    orig_local._4_4_ = 0;
  }
  else {
    i = width / block_size_x;
    j = height / block_size_y;
    if (i < 1) {
      i = 1;
    }
    if (j < 1) {
      j = 1;
    }
    for (index = 0; index < j; index = index + 1) {
      for (c = 0; c < i; c = c + 1) {
        for (sum_value = 0; sum_value < channels; sum_value = sum_value + 1) {
          local_60 = block_size_y;
          block_area = block_size_x;
          if (width < block_size_x * (c + 1)) {
            block_area = width - c * block_size_y;
          }
          if (height < block_size_y * (index + 1)) {
            local_60 = height - index * block_size_y;
          }
          v = block_area * local_60 >> 1;
          for (v_block = 0; v_block < local_60; v_block = v_block + 1) {
            for (u_block = 0; u_block < block_area; u_block = u_block + 1) {
              v = (uint)orig[index * block_size_y * width * channels + c * block_size_x * channels +
                             sum_value + v_block * width * channels + u_block * channels] + v;
            }
          }
          resampled[index * i * channels + c * channels + sum_value] =
               (uchar)(v / (block_area * local_60));
        }
      }
    }
    orig_local._4_4_ = 1;
  }
  return orig_local._4_4_;
}

Assistant:

int
	mipmap_image
	(
		const unsigned char* const orig,
		int width, int height, int channels,
		unsigned char* resampled,
		int block_size_x, int block_size_y
	)
{
	int mip_width, mip_height;
	int i, j, c;

	/*	error check	*/
	if( (width < 1) || (height < 1) ||
		(channels < 1) || (orig == NULL) ||
		(resampled == NULL) ||
		(block_size_x < 1) || (block_size_y < 1) )
	{
		/*	nothing to do	*/
		return 0;
	}
	mip_width = width / block_size_x;
	mip_height = height / block_size_y;
	if( mip_width < 1 )
	{
		mip_width = 1;
	}
	if( mip_height < 1 )
	{
		mip_height = 1;
	}
	for( j = 0; j < mip_height; ++j )
	{
		for( i = 0; i < mip_width; ++i )
		{
			for( c = 0; c < channels; ++c )
			{
				const int index = (j*block_size_y)*width*channels + (i*block_size_x)*channels + c;
				int sum_value;
				int u,v;
				int u_block = block_size_x;
				int v_block = block_size_y;
				int block_area;
				/*	do a bit of checking so we don't over-run the boundaries
					(necessary for non-square textures!)	*/
				if( block_size_x * (i+1) > width )
				{
					u_block = width - i*block_size_y;
				}
				if( block_size_y * (j+1) > height )
				{
					v_block = height - j*block_size_y;
				}
				block_area = u_block*v_block;
				/*	for this pixel, see what the average
					of all the values in the block are.
					note: start the sum at the rounding value, not at 0	*/
				sum_value = block_area >> 1;
				for( v = 0; v < v_block; ++v )
				for( u = 0; u < u_block; ++u )
				{
					sum_value += orig[index + v*width*channels + u*channels];
				}
				resampled[j*mip_width*channels + i*channels + c] = sum_value / block_area;
			}
		}
	}
	return 1;
}